

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.cc
# Opt level: O2

void __thiscall S2PointRegion::Encode(S2PointRegion *this,Encoder *encoder)

{
  int i;
  int b;
  double v;
  
  Encoder::Ensure(encoder,0x1e);
  Encoder::put8(encoder,'\x01');
  for (b = 0; b != 3; b = b + 1) {
    v = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                  ((BasicVector<Vector3,_double,_3UL> *)&this->point_,b);
    Encoder::put64(encoder,(uint64)v);
  }
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2PointRegion::Encode(Encoder* encoder) const {
  encoder->Ensure(30);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  for (int i = 0; i < 3; ++i) {
    encoder->putdouble(point_[i]);
  }
  S2_DCHECK_GE(encoder->avail(), 0);
}